

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

source_position
mjs::calc_source_position
          (wstring_view *t,uint32_t start_pos,uint32_t end_pos,source_position *start)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  source_position sVar4;
  uint32_t i;
  ulong uVar5;
  int iVar6;
  
  uVar5 = (ulong)start_pos;
  if (((t->_M_len < uVar5) || (end_pos < start_pos)) || (t->_M_len < (ulong)end_pos)) {
    __assert_fail("start_pos <= t.size() && end_pos <= t.size() && start_pos <= end_pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x2e,
                  "source_position mjs::calc_source_position(const std::wstring_view &, uint32_t, uint32_t, const source_position &)"
                 );
  }
  iVar6 = start->line + -1;
  iVar2 = start->column + -1;
  iVar3 = iVar6;
  do {
    if (end_pos == uVar5) {
      if (iVar3 < iVar6) {
        iVar3 = iVar6;
      }
      sVar4.line = iVar3 + 1;
      sVar4.column = iVar2 + 1;
      return sVar4;
    }
    wVar1 = t->_M_str[uVar5];
    if (wVar1 == L'\t') {
      iVar2 = (iVar2 - iVar2 % 8) + 8;
    }
    else {
      if (wVar1 == L'\r') {
        iVar6 = iVar6 + 1;
      }
      else {
        if (wVar1 != L'\n') {
          iVar2 = iVar2 + 1;
          goto LAB_00160284;
        }
        iVar3 = iVar3 + 1;
      }
      iVar2 = 0;
    }
LAB_00160284:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

source_position calc_source_position(const std::wstring_view& t, uint32_t start_pos, uint32_t end_pos, const source_position& start) {
    assert(start_pos <= t.size() && end_pos <= t.size() && start_pos <= end_pos);
    int cr = start.line-1, lf = start.line-1;
    int column = start.column-1;
    constexpr int tabstop = 8;
    for (uint32_t i = start_pos; i < end_pos; ++i) {
        switch (t[i]) {
        case '\n': ++lf; column = 0; break;
        case '\r': ++cr; column = 0; break;
        case '\t': column += tabstop - (column % tabstop); break;
        default: ++column;
        }
    }
    return {1 + std::max(cr, lf), 1 + column};
}